

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O3

void __thiscall duckdb::CreateTableInfo::CreateTableInfo(CreateTableInfo *this)

{
  char *__end;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,anon_var_dwarf_6372561 + 9,anon_var_dwarf_6372561 + 9);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,anon_var_dwarf_6372561 + 9,anon_var_dwarf_6372561 + 9);
  CreateInfo::CreateInfo(&this->super_CreateInfo,TABLE_ENTRY,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateTableInfo_024507a0;
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  (this->table)._M_string_length = 0;
  (this->table).field_2._M_local_buf[0] = '\0';
  ColumnList::ColumnList(&this->columns,false);
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).
  super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

CreateTableInfo::CreateTableInfo() : CreateInfo(CatalogType::TABLE_ENTRY, INVALID_SCHEMA) {
}